

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool.cpp
# Opt level: O0

void __thiscall UEFITool::extract(UEFITool *this,UINT8 mode)

{
  qsizetype *this_00;
  bool bVar1;
  byte bVar2;
  uint uVar3;
  QFlags<QMessageBox::StandardButton> local_794;
  QString local_790;
  QString local_778;
  QFlags<QIODeviceBase::OpenModeFlag> local_75c;
  undefined1 local_758 [8];
  QFile outputFile;
  QString local_748;
  QFlags<QFileDialog::Option> local_72c;
  QString local_728;
  QString local_710;
  QString local_6f8;
  QString local_6e0;
  QFlags<QFileDialog::Option> local_6c4;
  QString local_6c0;
  QString local_6a8;
  QString local_690;
  QString local_678;
  QFlags<QFileDialog::Option> local_65c;
  QString local_658;
  QString local_640;
  QString local_628;
  QString local_610;
  QFlags<QFileDialog::Option> local_5f4;
  QString local_5f0;
  QString local_5d8;
  QString local_5c0;
  QString local_5a8;
  QFlags<QFileDialog::Option> local_58c;
  QString local_588;
  QString local_570;
  QString local_558;
  QString local_540;
  QFlags<QFileDialog::Option> local_524;
  QString local_520;
  QString local_508;
  QString local_4f0;
  QString local_4d8;
  QFlags<QFileDialog::Option> local_4bc;
  QString local_4b8;
  QString local_4a0;
  QString local_488;
  QString local_470;
  QFlags<QFileDialog::Option> local_454;
  QString local_450;
  QString local_438;
  QString local_420;
  QString local_408;
  QFlags<QFileDialog::Option> local_3ec;
  QString local_3e8;
  QString local_3d0;
  QString local_3b8;
  QString local_3a0;
  QFlags<QFileDialog::Option> local_384;
  QString local_380;
  QString local_368;
  QString local_350;
  QString local_338;
  QFlags<QFileDialog::Option> local_31c;
  QString local_318;
  QString local_300;
  QString local_2e8;
  QString local_2d0;
  QFlags<QFileDialog::Option> local_2b4;
  QString local_2b0;
  QString local_298;
  QString local_280;
  QString local_268;
  QFlags<QFileDialog::Option> local_24c;
  QString local_248;
  QString local_230;
  QString local_218;
  QString local_200;
  QFlags<QFileDialog::Option> local_1e4;
  QString local_1e0;
  QString local_1c8;
  QString local_1b0;
  QString local_198;
  QFlags<QFileDialog::Option> local_17c;
  QString local_178;
  QString local_160;
  QString local_148;
  QString local_130;
  undefined1 local_118 [8];
  QString path;
  undefined1 local_f8 [4];
  UINT8 subtype;
  UINT8 type;
  QString local_e0;
  QString local_c8;
  uint local_b0;
  QFlags<QMessageBox::StandardButton> local_ac;
  QString local_a8;
  QString local_90;
  USTATUS local_68;
  USTATUS result;
  QString name;
  QByteArray extracted;
  QModelIndex index;
  UINT8 mode_local;
  UEFITool *this_local;
  
  QAbstractItemView::selectionModel();
  QItemSelectionModel::currentIndex();
  bVar1 = QModelIndex::isValid((QModelIndex *)&extracted.d.size);
  if (!bVar1) {
    return;
  }
  this_00 = &name.d.size;
  QByteArray::QByteArray((QByteArray *)this_00);
  QString::QString((QString *)&result);
  local_68 = FfsOperations::extract
                       (this->ffsOps,(QModelIndex *)&extracted.d.size,(QString *)&result,
                        (QByteArray *)this_00,mode);
  if (local_68 != 0) {
    tr(&local_90,"Extraction failed",(char *)0x0,-1);
    errorCodeToUString(&local_a8,local_68);
    QFlags<QMessageBox::StandardButton>::QFlags(&local_ac,FirstButton);
    QMessageBox::critical
              ((QWidget *)this,(QString *)&local_90,(QString *)&local_a8,
               (QFlags_conflict1 *)(ulong)(uint)local_ac.i,NoButton);
    QString::~QString(&local_a8);
    QString::~QString(&local_90);
    local_b0 = 1;
    goto LAB_0012dd0f;
  }
  path.d.size._6_2_ = QDir::separator();
  ::operator+((QString *)local_f8,&this->currentDir,path.d.size._6_2_);
  ::operator+(&local_e0,(QString *)local_f8,(QString *)&result);
  QDir::toNativeSeparators((QString *)&local_c8);
  QString::operator=((QString *)&result,&local_c8);
  QString::~QString(&local_c8);
  QString::~QString(&local_e0);
  QString::~QString((QString *)local_f8);
  path.d.size._5_1_ = TreeModel::type(this->model,(QModelIndex *)&extracted.d.size);
  path.d.size._4_1_ = TreeModel::subtype(this->model,(QModelIndex *)&extracted.d.size);
  QString::QString((QString *)local_118);
  if (mode == '\0') {
    uVar3 = path.d.size._5_1_ - 0x3d;
    if (uVar3 < 6 || path.d.size._5_1_ == 0x43) {
      switch((long)&switchD_0012c838::switchdataD_0025ef34 +
             (long)(int)(&switchD_0012c838::switchdataD_0025ef34)[uVar3]) {
      case 0x12c871:
        tr(&local_148,"Save capsule to file",(char *)0x0,-1);
        ::operator+(&local_160,(QString *)&result,".cap");
        tr(&local_178,"Capsule files (*.cap *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_17c);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_130,(QString *)this,(QString *)&local_148,(QString *)&local_160
                   ,(QString *)&local_178,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_130);
        QString::~QString(&local_130);
        QString::~QString(&local_178);
        QString::~QString(&local_160);
        QString::~QString(&local_148);
        break;
      case 0x12c9b6:
        tr(&local_1b0,"Save image to file",(char *)0x0,-1);
        ::operator+(&local_1c8,(QString *)&result,".rom");
        tr(&local_1e0,"Image files (*.rom *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_1e4);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_198,(QString *)this,(QString *)&local_1b0,(QString *)&local_1c8
                   ,(QString *)&local_1e0,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_198);
        QString::~QString(&local_198);
        QString::~QString(&local_1e0);
        QString::~QString(&local_1c8);
        QString::~QString(&local_1b0);
        break;
      case 0x12caea:
        tr(&local_218,"Save region to file",(char *)0x0,-1);
        ::operator+(&local_230,(QString *)&result,".rgn");
        tr(&local_248,"Region files (*.rgn *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_24c);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_200,(QString *)this,(QString *)&local_218,(QString *)&local_230
                   ,(QString *)&local_248,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_200);
        QString::~QString(&local_200);
        QString::~QString(&local_248);
        QString::~QString(&local_230);
        QString::~QString(&local_218);
        break;
      case 0x12cc1e:
        tr(&local_280,"Save padding to file",(char *)0x0,-1);
        ::operator+(&local_298,(QString *)&result,".pad");
        tr(&local_2b0,"Padding files (*.pad *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_2b4);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_268,(QString *)this,(QString *)&local_280,(QString *)&local_298
                   ,(QString *)&local_2b0,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_268);
        QString::~QString(&local_268);
        QString::~QString(&local_2b0);
        QString::~QString(&local_298);
        QString::~QString(&local_280);
        break;
      case 0x12cd52:
        tr(&local_2e8,"Save volume to file",(char *)0x0,-1);
        ::operator+(&local_300,(QString *)&result,".vol");
        tr(&local_318,"Volume files (*.vol *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_31c);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_2d0,(QString *)this,(QString *)&local_2e8,(QString *)&local_300
                   ,(QString *)&local_318,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_2d0);
        QString::~QString(&local_2d0);
        QString::~QString(&local_318);
        QString::~QString(&local_300);
        QString::~QString(&local_2e8);
        break;
      case 0x12ce86:
        tr(&local_350,"Save FFS file to file",(char *)0x0,-1);
        ::operator+(&local_368,(QString *)&result,".ffs");
        tr(&local_380,"FFS files (*.ffs *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_384);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_338,(QString *)this,(QString *)&local_350,(QString *)&local_368
                   ,(QString *)&local_380,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_338);
        QString::~QString(&local_338);
        QString::~QString(&local_380);
        QString::~QString(&local_368);
        QString::~QString(&local_350);
        break;
      case 0x12cfba:
        tr(&local_3b8,"Save section to file",(char *)0x0,-1);
        ::operator+(&local_3d0,(QString *)&result,".sct");
        tr(&local_3e8,"Section files (*.sct *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_3ec);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_3a0,(QString *)this,(QString *)&local_3b8,(QString *)&local_3d0
                   ,(QString *)&local_3e8,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_3a0);
        QString::~QString(&local_3a0);
        QString::~QString(&local_3e8);
        QString::~QString(&local_3d0);
        QString::~QString(&local_3b8);
      }
    }
    else {
      tr(&local_420,"Save object to file",(char *)0x0,-1);
      ::operator+(&local_438,(QString *)&result,".bin");
      tr(&local_450,"Binary files (*.bin);;All files (*)",(char *)0x0,-1);
      QFlags<QFileDialog::Option>::QFlags(&local_454);
      QFileDialog::getSaveFileName
                ((QWidget *)&local_408,(QString *)this,(QString *)&local_420,(QString *)&local_438,
                 (QString *)&local_450,(QFlags_conflict1 *)0x0);
      QString::operator=((QString *)local_118,&local_408);
      QString::~QString(&local_408);
      QString::~QString(&local_450);
      QString::~QString(&local_438);
      QString::~QString(&local_420);
    }
  }
  else if ((mode == '\x01') || (mode == '\x02')) {
    uVar3 = path.d.size._5_1_ - 0x3d;
    if (uVar3 < 6 || path.d.size._5_1_ == 0x43) {
      switch((long)&switchD_0012d269::switchdataD_0025ef18 +
             (long)(int)(&switchD_0012d269::switchdataD_0025ef18)[uVar3]) {
      case 0x12d26b:
        tr(&local_488,"Save capsule body to image file",(char *)0x0,-1);
        ::operator+(&local_4a0,(QString *)&result,".rom");
        tr(&local_4b8,"Image files (*.rom *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_4bc);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_470,(QString *)this,(QString *)&local_488,(QString *)&local_4a0
                   ,(QString *)&local_4b8,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_470);
        QString::~QString(&local_470);
        QString::~QString(&local_4b8);
        QString::~QString(&local_4a0);
        QString::~QString(&local_488);
        break;
      case 0x12d39f:
        tr(&local_4f0,"Save volume body to file",(char *)0x0,-1);
        ::operator+(&local_508,(QString *)&result,".vbd");
        tr(&local_520,"Volume body files (*.vbd *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_524);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_4d8,(QString *)this,(QString *)&local_4f0,(QString *)&local_508
                   ,(QString *)&local_520,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_4d8);
        QString::~QString(&local_4d8);
        QString::~QString(&local_520);
        QString::~QString(&local_508);
        QString::~QString(&local_4f0);
        break;
      case 0x12d4d3:
        tr(&local_558,"Save FFS file body to file",(char *)0x0,-1);
        ::operator+(&local_570,(QString *)&result,".fbd");
        tr(&local_588,"FFS file body files (*.fbd *.bin);;All files (*)",(char *)0x0,-1);
        QFlags<QFileDialog::Option>::QFlags(&local_58c);
        QFileDialog::getSaveFileName
                  ((QWidget *)&local_540,(QString *)this,(QString *)&local_558,(QString *)&local_570
                   ,(QString *)&local_588,(QFlags_conflict1 *)0x0);
        QString::operator=((QString *)local_118,&local_540);
        QString::~QString(&local_540);
        QString::~QString(&local_588);
        QString::~QString(&local_570);
        QString::~QString(&local_558);
        break;
      case 0x12d607:
        if (path.d.size._4_1_ == '\x17') {
          tr(&local_5c0,"Save section body to volume file",(char *)0x0,-1);
          ::operator+(&local_5d8,(QString *)&result,".vol");
          tr(&local_5f0,"Volume files (*.vol *.bin);;All files (*)",(char *)0x0,-1);
          QFlags<QFileDialog::Option>::QFlags(&local_5f4);
          QFileDialog::getSaveFileName
                    ((QWidget *)&local_5a8,(QString *)this,(QString *)&local_5c0,
                     (QString *)&local_5d8,(QString *)&local_5f0,(QFlags_conflict1 *)0x0);
          QString::operator=((QString *)local_118,&local_5a8);
          QString::~QString(&local_5a8);
          QString::~QString(&local_5f0);
          QString::~QString(&local_5d8);
          QString::~QString(&local_5c0);
        }
        else {
          if (((path.d.size._4_1_ != '\x10') && (path.d.size._4_1_ != '\x12')) &&
             (path.d.size._4_1_ != '\x11')) goto switchD_0012d269_caseD_12d8ab;
          tr(&local_628,"Save section body to EFI executable file",(char *)0x0,-1);
          ::operator+(&local_640,(QString *)&result,".efi");
          tr(&local_658,"EFI executable files (*.efi *.bin);;All files (*)",(char *)0x0,-1);
          QFlags<QFileDialog::Option>::QFlags(&local_65c);
          QFileDialog::getSaveFileName
                    ((QWidget *)&local_610,(QString *)this,(QString *)&local_628,
                     (QString *)&local_640,(QString *)&local_658,(QFlags_conflict1 *)0x0);
          QString::operator=((QString *)local_118,&local_610);
          QString::~QString(&local_610);
          QString::~QString(&local_658);
          QString::~QString(&local_640);
          QString::~QString(&local_628);
        }
        break;
      case 0x12d8ab:
        goto switchD_0012d269_caseD_12d8ab;
      }
    }
    else {
switchD_0012d269_caseD_12d8ab:
      tr(&local_690,"Save object body to file",(char *)0x0,-1);
      ::operator+(&local_6a8,(QString *)&result,".bin");
      tr(&local_6c0,"Binary files (*.bin);;All files (*)",(char *)0x0,-1);
      QFlags<QFileDialog::Option>::QFlags(&local_6c4);
      QFileDialog::getSaveFileName
                ((QWidget *)&local_678,(QString *)this,(QString *)&local_690,(QString *)&local_6a8,
                 (QString *)&local_6c0,(QFlags_conflict1 *)0x0);
      QString::operator=((QString *)local_118,&local_678);
      QString::~QString(&local_678);
      QString::~QString(&local_6c0);
      QString::~QString(&local_6a8);
      QString::~QString(&local_690);
    }
  }
  else {
    tr(&local_6f8,"Save object to file",(char *)0x0,-1);
    ::operator+(&local_710,(QString *)&result,".bin");
    tr(&local_728,"Binary files (*.bin);;All files (*)",(char *)0x0,-1);
    QFlags<QFileDialog::Option>::QFlags(&local_72c);
    QFileDialog::getSaveFileName
              ((QWidget *)&local_6e0,(QString *)this,(QString *)&local_6f8,(QString *)&local_710,
               (QString *)&local_728,(QFlags_conflict1 *)0x0);
    QString::operator=((QString *)local_118,&local_6e0);
    QString::~QString(&local_6e0);
    QString::~QString(&local_728);
    QString::~QString(&local_710);
    QString::~QString(&local_6f8);
  }
  QString::trimmed(&local_748,(QString *)local_118);
  bVar1 = QString::isEmpty(&local_748);
  QString::~QString(&local_748);
  if (bVar1) {
    local_b0 = 1;
  }
  else {
    QFile::QFile((QFile *)local_758);
    QFile::setFileName((QString *)local_758);
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags(&local_75c,WriteOnly);
    bVar2 = QFile::open((QFlags_conflict1 *)local_758);
    bVar1 = (bVar2 & 1) != 0;
    if (bVar1) {
      QFile::resize((longlong)local_758);
      QIODevice::write((QByteArray *)local_758);
      QFileDevice::close();
    }
    else {
      tr(&local_778,"Extraction failed",(char *)0x0,-1);
      tr(&local_790,"Can\'t open output file for rewriting",(char *)0x0,-1);
      QFlags<QMessageBox::StandardButton>::QFlags(&local_794,FirstButton);
      QMessageBox::critical
                ((QWidget *)this,(QString *)&local_778,(QString *)&local_790,
                 (QFlags_conflict1 *)(ulong)(uint)local_794.i,NoButton);
      QString::~QString(&local_790);
      QString::~QString(&local_778);
    }
    local_b0 = (uint)!bVar1;
    QFile::~QFile((QFile *)local_758);
  }
  QString::~QString((QString *)local_118);
LAB_0012dd0f:
  QString::~QString((QString *)&result);
  QByteArray::~QByteArray((QByteArray *)&name.d.size);
  return;
}

Assistant:

void UEFITool::extract(const UINT8 mode)
{
    QModelIndex index = ui->structureTreeView->selectionModel()->currentIndex();
    if (!index.isValid())
        return;
    
    QByteArray extracted;
    QString name;
    USTATUS result = ffsOps->extract(index, name, extracted, mode);
    if (result) {
        QMessageBox::critical(this, tr("Extraction failed"), errorCodeToUString(result), QMessageBox::Ok);
        return;
    }
    
    name = QDir::toNativeSeparators(currentDir + QDir::separator() + name);
    
    //ui->statusBar->showMessage(name);
    
    UINT8 type = model->type(index);
    UINT8 subtype = model->subtype(index);
    QString path;
    if (mode == EXTRACT_MODE_AS_IS) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule to file"), name + ".cap",  tr("Capsule files (*.cap *.bin);;All files (*)")); break;
            case Types::Image:   path = QFileDialog::getSaveFileName(this, tr("Save image to file"), name + ".rom",  tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Region:  path = QFileDialog::getSaveFileName(this, tr("Save region to file"), name + ".rgn",  tr("Region files (*.rgn *.bin);;All files (*)")); break;
            case Types::Padding: path = QFileDialog::getSaveFileName(this, tr("Save padding to file"), name + ".pad",  tr("Padding files (*.pad *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume to file"), name + ".vol",  tr("Volume files (*.vol *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file to file"), name + ".ffs",  tr("FFS files (*.ffs *.bin);;All files (*)")); break;
            case Types::Section: path = QFileDialog::getSaveFileName(this, tr("Save section to file"), name + ".sct",  tr("Section files (*.sct *.bin);;All files (*)")); break;
            default:             path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else if (mode == EXTRACT_MODE_BODY || mode == EXTRACT_MODE_BODY_UNCOMPRESSED) {
        switch (type) {
            case Types::Capsule: path = QFileDialog::getSaveFileName(this, tr("Save capsule body to image file"), name + ".rom", tr("Image files (*.rom *.bin);;All files (*)")); break;
            case Types::Volume:  path = QFileDialog::getSaveFileName(this, tr("Save volume body to file"), name + ".vbd", tr("Volume body files (*.vbd *.bin);;All files (*)")); break;
            case Types::File:    path = QFileDialog::getSaveFileName(this, tr("Save FFS file body to file"), name + ".fbd", tr("FFS file body files (*.fbd *.bin);;All files (*)")); break;
            case Types::Section:
                if (subtype == EFI_SECTION_FIRMWARE_VOLUME_IMAGE) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to volume file"), name + ".vol", tr("Volume files (*.vol *.bin);;All files (*)")); break;
                }
                else if (subtype == EFI_SECTION_PE32
                         || subtype == EFI_SECTION_TE
                         || subtype == EFI_SECTION_PIC) {
                    path = QFileDialog::getSaveFileName(this, tr("Save section body to EFI executable file"), name + ".efi", tr("EFI executable files (*.efi *.bin);;All files (*)")); break;
                }
            default: path = QFileDialog::getSaveFileName(this, tr("Save object body to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
        }
    }
    else path = QFileDialog::getSaveFileName(this, tr("Save object to file"), name + ".bin", tr("Binary files (*.bin);;All files (*)"));
    
    if (path.trimmed().isEmpty())
        return;
    
    QFile outputFile;
    outputFile.setFileName(path);
    if (!outputFile.open(QFile::WriteOnly)) {
        QMessageBox::critical(this, tr("Extraction failed"), tr("Can't open output file for rewriting"), QMessageBox::Ok);
        return;
    }
    outputFile.resize(0);
    outputFile.write(extracted);
    outputFile.close();
}